

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_upper(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  
  pcVar2 = luaL_checklstring(L,1,&l);
  b.p = b.buffer;
  b.lvl = 0;
  b.L = L;
  for (uVar4 = 0; uVar4 < l; uVar4 = uVar4 + 1) {
    if (&stack0xffffffffffffffd8 <= b.p) {
      luaL_prepbuffer(&b);
    }
    pcVar1 = b.p;
    pp_Var3 = __ctype_toupper_loc();
    b.p = pcVar1 + 1;
    *pcVar1 = (char)(*pp_Var3)[(byte)pcVar2[uVar4]];
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_upper(lua_State*L){
size_t l;
size_t i;
luaL_Buffer b;
const char*s=luaL_checklstring(L,1,&l);
luaL_buffinit(L,&b);
for(i=0;i<l;i++)
luaL_addchar(&b,toupper(uchar(s[i])));
luaL_pushresult(&b);
return 1;
}